

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O2

bool tinyusdz::srgb_8bit_to_linear_8bit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_img,size_t width,
               size_t height,size_t channels,size_t channel_stride,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out_img,string *err)

{
  int iVar1;
  ostream *poVar2;
  pointer puVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  size_t c;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  size_t u;
  long lVar15;
  bool bVar16;
  float fVar17;
  size_t dest_size;
  uint8_t linearlization_table [256];
  allocator local_21d;
  undefined4 local_21c;
  undefined1 local_218 [56];
  undefined1 local_1e0 [56];
  ostringstream local_1a8 [376];
  
  local_1e0._0_8_ = channel_stride;
  local_1e0._8_8_ = channels;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x214);
    ::std::operator<<(poVar2," ");
    pcVar5 = "width is zero.";
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x218);
    ::std::operator<<(poVar2," ");
    pcVar5 = "height is zero.";
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x21c);
    ::std::operator<<(poVar2," ");
    pcVar5 = "channels is zero.";
  }
  else {
    if (out_img != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      sVar14 = channels;
      if ((channel_stride == 0) || (sVar14 = channel_stride, channels <= channel_stride)) {
        local_218._0_8_ = height * width * sVar14;
        puVar3 = (in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish +
                 -(long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start;
        bVar16 = local_218._0_8_ - (long)puVar3 == 0;
        local_21c = (undefined4)
                    CONCAT71((int7)((ulong)puVar3 >> 8),(ulong)local_218._0_8_ < puVar3 || bVar16);
        if ((ulong)local_218._0_8_ < puVar3 || bVar16) {
          local_218._16_8_ = height;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_img,
                     local_218._0_8_);
          for (lVar15 = 0; lVar15 != 0x100; lVar15 = lVar15 + 1) {
            fVar17 = SrgbTransform::srgbToLinear((float)lVar15 / 255.0);
            iVar1 = (int)(fVar17 * 255.0);
            if (0xfe < iVar1) {
              iVar1 = 0xff;
            }
            if (iVar1 < 1) {
              iVar1 = 0;
            }
            local_1a8[lVar15] = SUB41(iVar1,0);
          }
          lVar15 = 0;
          sVar4 = channels;
          for (sVar6 = 0; sVar6 != local_218._16_8_; sVar6 = sVar6 + 1) {
            sVar7 = sVar4;
            lVar8 = lVar15;
            for (sVar9 = 0; sVar9 != width; sVar9 = sVar9 + 1) {
              lVar10 = lVar8;
              for (uVar12 = 0; sVar11 = sVar7, uVar13 = channels, uVar12 < channels;
                  uVar12 = uVar12 + 1) {
                *(ostringstream *)
                 ((out_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + lVar10) =
                     local_1a8[(in_img->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start[lVar10]];
                lVar10 = lVar10 + 1;
              }
              for (; uVar13 < sVar14; uVar13 = uVar13 + 1) {
                (out_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start[sVar11] =
                     (in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start[sVar11];
                sVar11 = sVar11 + 1;
              }
              lVar8 = lVar8 + sVar14;
              sVar7 = sVar7 + sVar14;
            }
            lVar15 = lVar15 + sVar14 * width;
            sVar4 = sVar4 + sVar14 * width;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x22d);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)(local_1e0 + 0x18),
                     "Insufficient input buffer size. must be the same or larger than {} but has {}"
                     ,&local_21d);
          local_1e0._16_8_ =
               (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(in_img->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          fmt::format<unsigned_long,unsigned_long>
                    ((string *)(local_218 + 0x18),(fmt *)(local_1e0 + 0x18),(string *)local_218,
                     (unsigned_long *)(local_1e0 + 0x10),(unsigned_long *)channel_stride);
          poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)(local_218 + 0x18));
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        }
        return (bool)(char)local_21c;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x227);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::string::string
                ((string *)(local_1e0 + 0x18),"channel_stride {} is smaller than input channels {}",
                 (allocator *)local_218);
      fmt::format<unsigned_long,unsigned_long>
                ((string *)(local_218 + 0x18),(fmt *)(local_1e0 + 0x18),(string *)local_1e0,
                 (unsigned_long *)(local_1e0 + 8),(unsigned_long *)channel_stride);
      poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)(local_218 + 0x18));
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_0034a0c3;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"srgb_8bit_to_linear_8bit");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x220);
    ::std::operator<<(poVar2," ");
    pcVar5 = "`out_img` is nullptr.";
  }
  poVar2 = ::std::operator<<((ostream *)local_1a8,pcVar5);
  ::std::operator<<(poVar2,"\n");
LAB_0034a0c3:
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool srgb_8bit_to_linear_8bit(const std::vector<uint8_t> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<uint8_t> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // TODO: Precompute table.
  uint8_t linearlization_table[256];
  for (size_t u = 0; u < 256; u++) {
    float f = float(u) / 255.0f;
    linearlization_table[u] = detail::f32_to_u8(SrgbTransform::srgbToLinear(f));
  }

  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = linearlization_table[in_img[idx]];
      }

      // remainder(usually alpha channel)
      // no op.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        (*out_img)[idx] = in_img[idx];
      }
    }
  }

  return true;
}